

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

bool __thiscall Image::is_approximately_equal_to(Image *this,Image *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Pixel *pPVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  double err [4];
  undefined4 local_7c;
  double local_78;
  double local_70;
  double local_68;
  Image *local_60;
  double local_58 [5];
  
  uVar1 = this->width;
  uVar13 = (ulong)uVar1;
  uVar2 = other->width;
  local_78 = (double)(ulong)uVar2;
  if (uVar1 == uVar2) {
    uVar3 = this->height;
    uVar4 = other->height;
    local_68 = (double)CONCAT44(local_68._4_4_,uVar4);
    if (uVar3 == uVar4) {
      local_60 = this;
      local_58[2] = 0.0;
      local_58[3] = 0.0;
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      bVar15 = uVar3 != 0;
      if (bVar15) {
        uVar5 = this->colors;
        pPVar6 = this->pixels;
        uVar12 = 0;
        local_70 = (double)CONCAT44(local_70._4_4_,uVar3);
        do {
          if (uVar13 != 0) {
            uVar11 = 0;
            bVar14 = uVar13 != 0;
            do {
              if ((ulong)uVar5 != 0) {
                uVar10 = 0;
                do {
                  if ((!(bool)(bVar14 & bVar15)) ||
                     (local_7c = *(undefined4 *)pPVar6[uVar12 * uVar1 + (int)uVar11].colors,
                     uVar2 <= uVar11 || uVar4 <= uVar12)) {
                    __assert_fail("(x < width) && (y < height)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/utils/Image.hpp"
                                  ,0x33,"Pixel Image::operator()(int, int) const");
                  }
                  local_7c = *(undefined4 *)other->pixels[uVar2 * uVar12 + (int)uVar11].colors;
                  local_58[uVar10] =
                       ABS((double)*(byte *)((long)&local_7c + uVar10) -
                           (double)*(byte *)((long)&local_7c + uVar10)) + local_58[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar5 != uVar10);
              }
              uVar11 = uVar11 + 1;
              bVar14 = uVar11 < uVar13;
            } while (uVar11 != uVar13);
          }
          uVar12 = uVar12 + 1;
          bVar15 = uVar12 < uVar3;
        } while (uVar12 != uVar3);
      }
      bVar15 = this->colors == 0;
      if (bVar15) {
        return bVar15;
      }
      local_70 = 1.0 / (double)(int)(uVar3 * uVar1);
      uVar13 = 0;
      while( true ) {
        local_78 = local_58[uVar13] * local_70;
        local_68 = this->error_threshold;
        if (local_68 < local_78) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Channel ",8);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," error threshold (",0x12);
          poVar7 = std::ostream::_M_insert<double>(this->error_threshold);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") exceeded.",0xb);
          lVar8 = 0x15;
          pcVar9 = "Average pixel error: ";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Channel ",8);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar13);
          lVar8 = 0x16;
          pcVar9 = " average pixel error: ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
        poVar7 = std::ostream::_M_insert<double>(local_78);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_68 < local_78) break;
        uVar13 = uVar13 + 1;
        bVar15 = this->colors <= uVar13;
        if (bVar15) {
          return bVar15;
        }
      }
      return bVar15;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Not approximately equal because dimensions are different.",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return false;
}

Assistant:

bool Image::is_approximately_equal_to(const Image *other) const {
  if ((width != other->width) || (height != other->height)) {
    std::cerr << "Not approximately equal because dimensions are different." << std::endl;
    return false;
  }

  // Calculate the error on each channel
  double err[4] = {0.0};
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        auto this_val = (double) pixel(x, y).colors[c];
        auto that_val = (double) other->pixel(x, y).colors[c];

        err[c] += std::sqrt(std::pow(this_val - that_val, 2));
      }
    }
  }

  int total_pixels = width * height;

  for (int c = 0; c < colors; c++) {
    auto channel_err = err[c] / total_pixels;
    if (channel_err > error_threshold) {
      std::cerr << "Channel " << c << " error threshold (" << error_threshold << ") exceeded."
                << "Average pixel error: " << channel_err << std::endl;
      return false;
    } else {
      std::cout << "Channel " << c << " average pixel error: " << channel_err << std::endl;
    }
  }
  return true;
}